

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

void __thiscall TCLAP::Arg::trimFlag(Arg *this,string *flag,string *value)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  string local_68 [32];
  string local_48 [32];
  uint local_28;
  uint local_24;
  int i;
  int stop;
  string *value_local;
  string *flag_local;
  Arg *this_local;
  
  local_24 = 0;
  local_28 = 0;
  _i = value;
  value_local = flag;
  flag_local = (string *)this;
  do {
    uVar3 = (ulong)local_28;
    uVar4 = std::__cxx11::string::length();
    if (uVar4 <= uVar3) {
LAB_00177927:
      if (1 < (int)local_24) {
        std::__cxx11::string::substr((ulong)local_48,(ulong)value_local);
        std::__cxx11::string::operator=((string *)_i,local_48);
        std::__cxx11::string::~string(local_48);
        std::__cxx11::string::substr((ulong)local_68,(ulong)value_local);
        std::__cxx11::string::operator=((string *)value_local,local_68);
        std::__cxx11::string::~string(local_68);
      }
      return;
    }
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value_local);
    cVar1 = *pcVar5;
    cVar2 = delimiter();
    if (cVar1 == cVar2) {
      local_24 = local_28;
      goto LAB_00177927;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

inline void Arg::trimFlag(std::string& flag, std::string& value) const
{
	int stop = 0;
	for ( int i = 0; static_cast<unsigned int>(i) < flag.length(); i++ )
		if ( flag[i] == Arg::delimiter() )
		{
			stop = i;
			break;
		}

	if ( stop > 1 )
	{
		value = flag.substr(stop+1);
		flag = flag.substr(0,stop);
	}

}